

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Model_add_parameter
               (HTS_Model *model,size_t state_index,char *string,double *mean,double *vari,
               double *msd,double weight)

{
  ulong uVar1;
  HTS_Model *in_RCX;
  long *in_RDI;
  size_t in_R8;
  double *in_R9;
  size_t *in_XMM0_Qa;
  size_t len;
  size_t pdf_index;
  size_t tree_index;
  size_t i;
  long local_50;
  long local_48;
  size_t *in_stack_ffffffffffffffc0;
  ulong uVar2;
  
  uVar1 = *in_RDI * in_RDI[1];
  HTS_Model_get_index(in_RCX,in_R8,(char *)in_R9,in_XMM0_Qa,in_stack_ffffffffffffffc0);
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    (&in_RCX->vector_length)[uVar2] =
         (size_t)((double)in_XMM0_Qa *
                  (double)*(float *)(*(long *)(*(long *)(in_RDI[5] + local_48 * 8) + local_50 * 8) +
                                    uVar2 * 4) + (double)(&in_RCX->vector_length)[uVar2]);
    *(double *)(in_R8 + uVar2 * 8) =
         (double)in_XMM0_Qa *
         (double)*(float *)(*(long *)(*(long *)(in_RDI[5] + local_48 * 8) + local_50 * 8) +
                           (uVar2 + uVar1) * 4) + *(double *)(in_R8 + uVar2 * 8);
  }
  if ((in_R9 != (double *)0x0) && ((char)in_RDI[2] == '\x01')) {
    *in_R9 = (double)in_XMM0_Qa *
             (double)*(float *)(*(long *)(*(long *)(in_RDI[5] + local_48 * 8) + local_50 * 8) +
                               uVar1 * 8) + *in_R9;
  }
  return;
}

Assistant:

static void HTS_Model_add_parameter(HTS_Model * model, size_t state_index, const char *string, double *mean, double *vari, double *msd, double weight)
{
   size_t i;
   size_t tree_index, pdf_index;
   size_t len = model->vector_length * model->num_windows;

   HTS_Model_get_index(model, state_index, string, &tree_index, &pdf_index);
   for (i = 0; i < len; i++) {
      mean[i] += weight * model->pdf[tree_index][pdf_index][i];
      vari[i] += weight * model->pdf[tree_index][pdf_index][i + len];
   }
   if (msd != NULL && model->is_msd == TRUE)
      *msd += weight * model->pdf[tree_index][pdf_index][len + len];
}